

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Value.cpp
# Opt level: O2

bool __thiscall Value::asBoolean(Value *this)

{
  ThrowPacket *this_00;
  allocator<char> local_49;
  undefined1 local_48 [48];
  
  this_00 = (ThrowPacket *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(local_48 + 0x10),"Could not cast value to Boolean",&local_49);
  ExceptionObjects::bad_cast((string *)local_48);
  ThrowPacket::ThrowPacket(this_00,(ptr<Value> *)local_48);
  __cxa_throw(this_00,&ThrowPacket::typeinfo,CarrierPacket::~CarrierPacket);
}

Assistant:

bool Value::asBoolean() {
    throw ThrowPacket(ExceptionObjects::bad_cast("Could not cast value to Boolean"));
}